

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

QString * __thiscall
QSpinBox::textFromValue(QString *__return_storage_ptr__,QSpinBox *this,int value)

{
  uint uVar1;
  long lVar2;
  QLatin1String *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  long in_FS_OFFSET;
  QLocale loc;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QStringBuilder<const_QLatin1String_&,_QString> local_78;
  QString local_58;
  QLatin1String local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(int *)(lVar2 + 0x3d4) == 10) {
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale((QLocale *)&local_58,(QWidget *)this);
    uVar1 = *(uint *)(lVar2 + 0x3d0);
    uVar6 = QLocale::numberOptions();
    QLocale::setNumberOptions(&local_58,(uint)((uVar1 >> 9 & 1) == 0) | uVar6 & 0xfffffffe);
    QLocale::toString((longlong)&local_78);
    pQVar3 = local_78.a;
    local_78.a = (QLatin1String *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pQVar3;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_78.b.d.d;
    local_78.b.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).size = (qsizetype)local_78.b.d.ptr;
    QLocale::~QLocale((QLocale *)&local_58);
  }
  else {
    local_40.m_size = (qsizetype)((uint)value >> 0x1f);
    local_40.m_data = "";
    if (value < 0) {
      local_40.m_data = "-";
    }
    iVar7 = -value;
    if (0 < value) {
      iVar7 = value;
    }
    QString::number((int)&local_98,iVar7);
    local_78.b.d.size = local_88;
    local_78.b.d.ptr = pcStack_90;
    local_78.b.d.d = (Data *)local_98;
    local_98 = (QArrayData *)0x0;
    pcStack_90 = (char16_t *)0x0;
    local_88 = 0;
    local_78.a = &local_40;
    QStringBuilder<const_QLatin1String_&,_QString>::convertTo<QString>(&local_58,&local_78);
    uVar4 = local_58.d.d._0_4_;
    uVar5 = local_58.d.d._4_4_;
    local_58.d.d = (Data *)0x0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar5;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_58.d.ptr._4_4_;
    local_58.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.size = 0;
    if (&(local_78.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSpinBox::textFromValue(int value) const
{
    Q_D(const QSpinBox);
    QString str;

    if (d->displayIntegerBase != 10) {
        const auto prefix = value < 0 ? "-"_L1 : ""_L1;
        str = prefix + QString::number(qAbs(value), d->displayIntegerBase);
    } else {
        QLocale loc = locale();
        if (d->showGroupSeparator)
            loc.setNumberOptions(loc.numberOptions() & ~QLocale::OmitGroupSeparator);
        else
            loc.setNumberOptions(loc.numberOptions() | QLocale::OmitGroupSeparator);
        str = loc.toString(value);
    }

    return str;
}